

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_fwd_txfm_sse4.c
# Opt level: O2

void load_buffer_32x8n(int16_t *input,__m128i *out,int stride,int flipud,int fliplr,int shift,
                      int height)

{
  ulong uVar1;
  bool bVar2;
  
  uVar1 = (ulong)(uint)fliplr;
  if (fliplr < 1) {
    uVar1 = 0;
  }
  while (bVar2 = uVar1 != 0, uVar1 = uVar1 - 1, bVar2) {
    load_buffer_4x4(input,out,4,0,0,flipud);
    load_buffer_4x4(input + 0x10,out + 4,4,0,0,flipud);
    out = out + 8;
    input = input + stride;
  }
  return;
}

Assistant:

static inline void load_buffer_32x8n(const int16_t *input, __m128i *out,
                                     int stride, int flipud, int fliplr,
                                     int shift, const int height) {
  const int16_t *in = input;
  __m128i *output = out;
  for (int col = 0; col < height; col++) {
    in = input + col * stride;
    output = out + col * 8;
    load_buffer_4x4(in, output, 4, flipud, fliplr, shift);
    load_buffer_4x4((in + 16), (output + 4), 4, flipud, fliplr, shift);
  }
}